

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::LoadConfigFile(FConfigFile *this)

{
  bool bVar1;
  char *__filename;
  FILE *__stream;
  bool succ;
  FILE *file;
  FConfigFile *this_local;
  
  __filename = FString::operator_cast_to_char_(&this->PathName);
  __stream = fopen(__filename,"r");
  this->FileExisted = false;
  if (__stream != (FILE *)0x0) {
    bVar1 = ReadConfig(this,__stream);
    fclose(__stream);
    this->FileExisted = bVar1;
  }
  return;
}

Assistant:

void FConfigFile::LoadConfigFile ()
{
	FILE *file = fopen (PathName, "r");
	bool succ;

	FileExisted = false;
	if (file == NULL)
	{
		return;
	}

	succ = ReadConfig (file);
	fclose (file);
	FileExisted = succ;
}